

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::checkConfiguration(QPDFJob *this)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  undefined8 extraout_RAX;
  byte bVar4;
  byte bVar5;
  element_type *peVar6;
  allocator<char> local_59;
  string local_58;
  allocator<char> local_31;
  key_type local_30;
  
  peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6->replace_input == true) {
    if ((peVar6->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_0015f529;
    if (peVar6->split_pages == 0) {
      if (peVar6->json_version != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"--json may not be used with --replace-input",
                   (allocator<char> *)&local_30);
        usage(&local_58);
        goto LAB_0015f26e;
      }
      goto LAB_0015f2d0;
    }
LAB_0015f549:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"--split-pages may not be used with --replace-input",
               (allocator<char> *)&local_30);
    usage(&local_58);
LAB_0015f569:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"--replace-input may not be used with --empty",
               (allocator<char> *)&local_30);
    usage(&local_58);
LAB_0015f589:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"no output file may be given for this option",
               (allocator<char> *)&local_30);
    usage(&local_58);
LAB_0015f5a9:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "--requires-password and --is-encrypted may not be given together",
               (allocator<char> *)&local_30);
    usage(&local_58);
LAB_0015f5c9:
    std::__cxx11::string::~string((string *)&local_58);
LAB_0015f5d3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "json keys \"objects\" and \"objectinfo\" are only valid for json version 1",
               (allocator<char> *)&local_30);
    usage(&local_58);
  }
  else {
LAB_0015f26e:
    if ((peVar6->json_version != 0) &&
       ((peVar6->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"-",&local_59);
      QUtil::make_shared_cstr((QUtil *)&local_30,&local_58);
      std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_string_length);
      std::__cxx11::string::~string((string *)&local_58);
      peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
LAB_0015f2d0:
    pcVar2 = (peVar6->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pcVar2 == (char *)0x0) {
LAB_0015f509:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"an input file name is required",(allocator<char> *)&local_30);
      usage(&local_58);
LAB_0015f529:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "--replace-input may not be used when an output file is specified",
                 (allocator<char> *)&local_30);
      usage(&local_58);
      goto LAB_0015f549;
    }
    if ((peVar6->replace_input == true) && (*pcVar2 == '\0')) goto LAB_0015f569;
    bVar4 = peVar6->require_outfile;
    pcVar2 = (peVar6->outfilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar5 = pcVar2 != (char *)0x0 | peVar6->replace_input;
    if ((bool)bVar4 != true) {
LAB_0015f337:
      if (bVar5 == 0) {
        pcVar2 = (char *)0x0;
        goto LAB_0015f342;
      }
      goto LAB_0015f589;
    }
    if (bVar5 == 0) {
      bVar5 = 0xbd;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"an output file name is required; use - for standard output",
                 (allocator<char> *)&local_30);
      usage(&local_58);
      goto LAB_0015f337;
    }
LAB_0015f342:
    if ((peVar6->check_requires_password == true) && (peVar6->check_is_encrypted == true))
    goto LAB_0015f5a9;
    if (((peVar6->encrypt == true) &&
        (((peVar6->allow_insecure == false && ((peVar6->owner_password)._M_string_length == 0)) &&
         ((peVar6->user_password)._M_string_length != 0)))) && (peVar6->keylen == 0x100))
    goto LAB_0015f613;
    if ((((bVar4 & pcVar2 != (char *)0x0) == 1) && (*pcVar2 == '-')) && (pcVar2[1] == '\0')) {
      if (peVar6->split_pages != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,
                   "--split-pages may not be used when writing to standard output",
                   (allocator<char> *)&local_30);
        usage(&local_58);
        goto LAB_0015f509;
      }
LAB_0015f3b9:
      QPDFLogger::saveToStandardOutput
                ((peVar6->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 true);
      peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else if ((peVar6->attachment_to_show)._M_string_length != 0) goto LAB_0015f3b9;
    if (peVar6->split_pages != 0) {
LAB_0015f3ec:
      if (peVar6->json_version == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"qpdf",(allocator<char> *)&local_30);
        peVar6 = (element_type *)&peVar6->json_keys;
        this = (QPDFJob *)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)peVar6,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        if (this == (QPDFJob *)0x0) {
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"json key \"qpdf\" is only valid for json version > 1",
                   (allocator<char> *)&local_30);
        usage(&local_58);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"objectinfo",&local_59)
      ;
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&peVar6->json_keys,&local_58);
      if (sVar3 != 0) goto LAB_0015f5c9;
      peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"objects",&local_31);
      sVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&peVar6->json_keys,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_58);
      if (sVar3 == 0) {
        return;
      }
      goto LAB_0015f5d3;
    }
    bVar1 = QUtil::same_file((peVar6->infilename).
                             super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (peVar6->outfilename).
                             super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (!bVar1) {
      peVar6 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      goto LAB_0015f3ec;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "input file and output file are the same; use --replace-input to intentionally overwrite the input file"
             ,(allocator<char> *)&local_30);
  usage(&local_58);
LAB_0015f613:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "A PDF with a non-empty user password and an empty owner password encrypted with a 256-bit key is insecure as it can be opened without a password. If you really want to do this, you must also give the --allow-insecure option before the -- that follows --encrypt."
             ,(allocator<char> *)&local_30);
  usage(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
QPDFJob::checkConfiguration()
{
    // Do final checks for command-line consistency. (I always think this is called doFinalChecks,
    // so I'm putting that in a comment.)

    if (m->replace_input) {
        // Check for --empty appears later after we have checked m->infilename.
        if (m->outfilename) {
            usage("--replace-input may not be used when an output file is specified");
        } else if (m->split_pages) {
            usage("--split-pages may not be used with --replace-input");
        } else if (m->json_version) {
            usage("--json may not be used with --replace-input");
        }
    }
    if (m->json_version && (m->outfilename == nullptr)) {
        // The output file is optional with --json for backward compatibility and defaults to
        // standard output.
        m->outfilename = QUtil::make_shared_cstr("-");
    }
    if (m->infilename == nullptr) {
        usage("an input file name is required");
    } else if (m->replace_input && (strlen(m->infilename.get()) == 0)) {
        usage("--replace-input may not be used with --empty");
    } else if (m->require_outfile && (m->outfilename == nullptr) && (!m->replace_input)) {
        usage("an output file name is required; use - for standard output");
    } else if ((!m->require_outfile) && ((m->outfilename != nullptr) || m->replace_input)) {
        usage("no output file may be given for this option");
    }
    if (m->check_requires_password && m->check_is_encrypted) {
        usage("--requires-password and --is-encrypted may not be given together");
    }

    if (m->encrypt && (!m->allow_insecure) &&
        (m->owner_password.empty() && (!m->user_password.empty()) && (m->keylen == 256))) {
        // Note that empty owner passwords for R < 5 are copied from the user password, so this lack
        // of security is not an issue for those files. Also we are consider only the ability to
        // open the file without a password to be insecure. We are not concerned about whether the
        // viewer enforces security settings when the user and owner password match.
        usage(
            "A PDF with a non-empty user password and an empty owner password encrypted with a "
            "256-bit key is insecure as it can be opened without a password. If you really want to"
            " do this, you must also give the --allow-insecure option before the -- that follows "
            "--encrypt.");
    }

    bool save_to_stdout = false;
    if (m->require_outfile && m->outfilename && (strcmp(m->outfilename.get(), "-") == 0)) {
        if (m->split_pages) {
            usage("--split-pages may not be used when writing to standard output");
        }
        save_to_stdout = true;
    }
    if (!m->attachment_to_show.empty()) {
        save_to_stdout = true;
    }
    if (save_to_stdout) {
        m->log->saveToStandardOutput(true);
    }
    if ((!m->split_pages) && QUtil::same_file(m->infilename.get(), m->outfilename.get())) {
        QTC::TC("qpdf", "QPDFJob same file error");
        usage(
            "input file and output file are the same; use --replace-input to intentionally "
            "overwrite the input file");
    }

    if (m->json_version == 1) {
        if (m->json_keys.count("qpdf")) {
            usage("json key \"qpdf\" is only valid for json version > 1");
        }
    } else {
        if (m->json_keys.count("objectinfo") || m->json_keys.count("objects")) {
            usage("json keys \"objects\" and \"objectinfo\" are only valid for json version 1");
        }
    }
}